

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersector1<4,_1,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  uint uVar2;
  ulong uVar3;
  undefined8 uVar4;
  Geometry *this;
  undefined1 (*pauVar5) [16];
  bool bVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  undefined4 uVar15;
  ulong unaff_R15;
  size_t mask;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar27;
  float fVar28;
  undefined1 auVar25 [16];
  float fVar29;
  undefined1 auVar26 [16];
  float fVar30;
  float fVar33;
  float fVar34;
  undefined1 auVar31 [16];
  float fVar35;
  undefined1 auVar32 [16];
  float fVar36;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1058 [8];
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [8];
  float fStack_1040;
  float fStack_103c;
  undefined1 local_1038 [8];
  float fStack_1030;
  float fStack_102c;
  float local_1028 [4];
  ulong local_1018;
  undefined1 (*local_1010) [16];
  long local_1008;
  ulong local_1000;
  undefined1 local_ff8 [8];
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [8];
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [8];
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [16];
  undefined1 local_f88 [8];
  float fStack_f80;
  float fStack_f7c;
  undefined1 local_f78 [8];
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_f78 = (undefined1  [8])*(undefined8 *)&This->ptr[1].bounds.bounds0.lower.field_0;
  uStack_f70 = 0;
  local_1038._4_4_ = (query->p).field_0.field_0.x;
  local_1048._4_4_ = (query->p).field_0.field_0.y;
  local_1058._4_4_ = (query->p).field_0.field_0.z;
  fVar24 = (context->query_radius).field_0.m128[0];
  fVar27 = (context->query_radius).field_0.m128[1];
  fVar28 = (context->query_radius).field_0.m128[2];
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_f98 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar1 = (context->query_radius).field_0;
    local_f98 = dpps((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
  }
  local_1010 = (undefined1 (*) [16])local_f68;
  local_1038._0_4_ = local_1038._4_4_;
  fStack_1030 = (float)local_1038._4_4_;
  fStack_102c = (float)local_1038._4_4_;
  local_1048._0_4_ = local_1048._4_4_;
  fStack_1040 = (float)local_1048._4_4_;
  fStack_103c = (float)local_1048._4_4_;
  local_1058._0_4_ = local_1058._4_4_;
  fStack_1050 = (float)local_1058._4_4_;
  fStack_104c = (float)local_1058._4_4_;
  bVar7 = false;
  local_1018 = unaff_R15;
  do {
    local_fc8 = (float)local_1038._4_4_ - fVar24;
    fStack_fc4 = (float)local_1038._4_4_ - fVar24;
    fStack_fc0 = (float)local_1038._4_4_ - fVar24;
    fStack_fbc = (float)local_1038._4_4_ - fVar24;
    local_fd8 = (float)local_1038._4_4_ + fVar24;
    fStack_fd4 = (float)local_1038._4_4_ + fVar24;
    fStack_fd0 = (float)local_1038._4_4_ + fVar24;
    fStack_fcc = (float)local_1038._4_4_ + fVar24;
    local_fe8._0_4_ = (float)local_1048._4_4_ - fVar27;
    local_fe8._4_4_ = (float)local_1048._4_4_ - fVar27;
    fStack_fe0 = (float)local_1048._4_4_ - fVar27;
    fStack_fdc = (float)local_1048._4_4_ - fVar27;
    local_fa8 = fVar27 + (float)local_1048._4_4_;
    fStack_fa4 = fVar27 + (float)local_1048._4_4_;
    fStack_fa0 = fVar27 + (float)local_1048._4_4_;
    fStack_f9c = fVar27 + (float)local_1048._4_4_;
    local_ff8._0_4_ = (float)local_1058._4_4_ - fVar28;
    local_ff8._4_4_ = (float)local_1058._4_4_ - fVar28;
    fStack_ff0 = (float)local_1058._4_4_ - fVar28;
    fStack_fec = (float)local_1058._4_4_ - fVar28;
    local_fb8._0_4_ = fVar28 + (float)local_1058._4_4_;
    local_fb8._4_4_ = fVar28 + (float)local_1058._4_4_;
    fStack_fb0 = fVar28 + (float)local_1058._4_4_;
    fStack_fac = fVar28 + (float)local_1058._4_4_;
    local_f88._0_4_ = fVar24 * fVar24;
    local_f88._4_4_ = fVar24 * fVar24;
    fStack_f80 = fVar24 * fVar24;
    fStack_f7c = fVar24 * fVar24;
    auVar44 = local_f98;
    do {
      do {
        do {
          if (local_1010 == (undefined1 (*) [16])local_f78) {
            return bVar7;
          }
          pauVar5 = local_1010 + -1;
          local_1010 = local_1010 + -1;
        } while (auVar44._0_4_ < *(float *)(*pauVar5 + 8));
        uVar9 = *(ulong *)*local_1010;
        do {
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar9 & 8) == 0) {
              auVar23 = *(undefined1 (*) [16])(uVar9 + 0x20);
              auVar26 = *(undefined1 (*) [16])(uVar9 + 0x30);
              auVar25 = maxps(_local_1038,auVar23);
              auVar25 = minps(auVar25,auVar26);
              auVar31 = maxps(_local_1048,*(undefined1 (*) [16])(uVar9 + 0x40));
              fVar24 = auVar25._0_4_ - (float)local_1038._4_4_;
              fVar27 = auVar25._4_4_ - (float)local_1038._4_4_;
              fVar28 = auVar25._8_4_ - (float)local_1038._4_4_;
              fVar29 = auVar25._12_4_ - (float)local_1038._4_4_;
              auVar25 = minps(auVar31,*(undefined1 (*) [16])(uVar9 + 0x50));
              auVar31 = maxps(_local_1058,*(undefined1 (*) [16])(uVar9 + 0x60));
              auVar31 = minps(auVar31,*(undefined1 (*) [16])(uVar9 + 0x70));
              fVar30 = auVar25._0_4_ - (float)local_1048._4_4_;
              fVar33 = auVar25._4_4_ - (float)local_1048._4_4_;
              fVar34 = auVar25._8_4_ - (float)local_1048._4_4_;
              fVar35 = auVar25._12_4_ - (float)local_1048._4_4_;
              fVar36 = auVar31._0_4_ - (float)local_1058._4_4_;
              fVar40 = auVar31._4_4_ - (float)local_1058._4_4_;
              fVar41 = auVar31._8_4_ - (float)local_1058._4_4_;
              fVar42 = auVar31._12_4_ - (float)local_1058._4_4_;
              local_1028[0] = fVar36 * fVar36 + fVar30 * fVar30 + fVar24 * fVar24;
              local_1028[1] = fVar40 * fVar40 + fVar33 * fVar33 + fVar27 * fVar27;
              local_1028[2] = fVar41 * fVar41 + fVar34 * fVar34 + fVar28 * fVar28;
              local_1028[3] = fVar42 * fVar42 + fVar35 * fVar35 + fVar29 * fVar29;
              auVar39._0_4_ =
                   -(uint)(auVar23._0_4_ <= auVar26._0_4_ && local_1028[0] <= (float)local_f88._0_4_
                          );
              auVar39._4_4_ =
                   -(uint)(auVar23._4_4_ <= auVar26._4_4_ && local_1028[1] <= (float)local_f88._4_4_
                          );
              auVar39._8_4_ = -(uint)(auVar23._8_4_ <= auVar26._8_4_ && local_1028[2] <= fStack_f80)
              ;
              auVar39._12_4_ =
                   -(uint)(auVar23._12_4_ <= auVar26._12_4_ && local_1028[3] <= fStack_f7c);
LAB_00e72088:
              uVar15 = movmskps((int)local_1018,auVar39);
              local_1018 = CONCAT44((int)(local_1018 >> 0x20),uVar15);
            }
          }
          else if ((uVar9 & 8) == 0) {
            auVar23 = *(undefined1 (*) [16])(uVar9 + 0x60);
            auVar26 = *(undefined1 (*) [16])(uVar9 + 0x20);
            auVar25 = *(undefined1 (*) [16])(uVar9 + 0x30);
            auVar31 = *(undefined1 (*) [16])(uVar9 + 0x40);
            auVar38 = *(undefined1 (*) [16])(uVar9 + 0x50);
            auVar20 = *(undefined1 (*) [16])(uVar9 + 0x70);
            auVar39 = maxps(_local_1038,auVar26);
            auVar39 = minps(auVar39,auVar25);
            fVar24 = auVar39._0_4_ - (float)local_1038._4_4_;
            fVar28 = auVar39._4_4_ - (float)local_1038._4_4_;
            fVar30 = auVar39._8_4_ - (float)local_1038._4_4_;
            fVar34 = auVar39._12_4_ - (float)local_1038._4_4_;
            auVar39 = maxps(_local_1048,auVar31);
            auVar39 = minps(auVar39,auVar38);
            fVar36 = auVar39._0_4_ - (float)local_1048._4_4_;
            fVar40 = auVar39._4_4_ - (float)local_1048._4_4_;
            fVar41 = auVar39._8_4_ - (float)local_1048._4_4_;
            fVar42 = auVar39._12_4_ - (float)local_1048._4_4_;
            auVar39 = maxps(_local_1058,auVar23);
            auVar39 = minps(auVar39,auVar20);
            fVar27 = auVar39._0_4_ - (float)local_1058._4_4_;
            fVar29 = auVar39._4_4_ - (float)local_1058._4_4_;
            fVar33 = auVar39._8_4_ - (float)local_1058._4_4_;
            fVar35 = auVar39._12_4_ - (float)local_1058._4_4_;
            local_1028[0] = fVar27 * fVar27 + fVar36 * fVar36 + fVar24 * fVar24;
            local_1028[1] = fVar29 * fVar29 + fVar40 * fVar40 + fVar28 * fVar28;
            local_1028[2] = fVar33 * fVar33 + fVar41 * fVar41 + fVar30 * fVar30;
            local_1028[3] = fVar35 * fVar35 + fVar42 * fVar42 + fVar34 * fVar34;
            auVar39._0_4_ =
                 (uint)(((auVar23._0_4_ <= (float)local_fb8._0_4_ && local_fc8 <= auVar25._0_4_) &&
                        (auVar31._0_4_ <= local_fa8 && auVar26._0_4_ <= local_fd8)) &&
                       ((float)local_ff8._0_4_ <= auVar20._0_4_ &&
                       ((float)local_fe8._0_4_ <= auVar38._0_4_ && auVar26._0_4_ <= auVar25._0_4_)))
                 * -0x80000000;
            auVar39._4_4_ =
                 (uint)(((auVar23._4_4_ <= (float)local_fb8._4_4_ && fStack_fc4 <= auVar25._4_4_) &&
                        (auVar31._4_4_ <= fStack_fa4 && auVar26._4_4_ <= fStack_fd4)) &&
                       ((float)local_ff8._4_4_ <= auVar20._4_4_ &&
                       ((float)local_fe8._4_4_ <= auVar38._4_4_ && auVar26._4_4_ <= auVar25._4_4_)))
                 * -0x80000000;
            auVar39._8_4_ =
                 (uint)(((auVar23._8_4_ <= fStack_fb0 && fStack_fc0 <= auVar25._8_4_) &&
                        (auVar31._8_4_ <= fStack_fa0 && auVar26._8_4_ <= fStack_fd0)) &&
                       (fStack_ff0 <= auVar20._8_4_ &&
                       (fStack_fe0 <= auVar38._8_4_ && auVar26._8_4_ <= auVar25._8_4_))) *
                 -0x80000000;
            auVar39._12_4_ =
                 (uint)(((auVar23._12_4_ <= fStack_fac && fStack_fbc <= auVar25._12_4_) &&
                        (auVar31._12_4_ <= fStack_f9c && auVar26._12_4_ <= fStack_fcc)) &&
                       (fStack_fec <= auVar20._12_4_ &&
                       (fStack_fdc <= auVar38._12_4_ && auVar26._12_4_ <= auVar25._12_4_))) *
                 -0x80000000;
            goto LAB_00e72088;
          }
          if ((uVar9 & 8) == 0) {
            if (local_1018 == 0) {
              iVar8 = 4;
            }
            else {
              uVar12 = uVar9 & 0xfffffffffffffff0;
              lVar13 = 0;
              if (local_1018 != 0) {
                for (; (local_1018 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                }
              }
              iVar8 = 0;
              uVar9 = *(ulong *)(uVar12 + lVar13 * 8);
              uVar11 = local_1018 - 1 & local_1018;
              if (uVar11 != 0) {
                fVar24 = local_1028[lVar13];
                lVar13 = 0;
                if (uVar11 != 0) {
                  for (; (uVar11 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                  }
                }
                uVar3 = *(ulong *)(uVar12 + lVar13 * 8);
                fVar27 = local_1028[lVar13];
                uVar11 = uVar11 - 1 & uVar11;
                if (uVar11 == 0) {
                  if ((uint)fVar24 < (uint)fVar27) {
                    *(ulong *)*local_1010 = uVar3;
                    *(float *)(*local_1010 + 8) = fVar27;
                    local_1010 = local_1010 + 1;
                  }
                  else {
                    *(ulong *)*local_1010 = uVar9;
                    *(float *)(*local_1010 + 8) = fVar24;
                    local_1010 = local_1010 + 1;
                    uVar9 = uVar3;
                  }
                }
                else {
                  auVar23._8_4_ = fVar24;
                  auVar23._0_8_ = uVar9;
                  auVar23._12_4_ = 0;
                  auVar26._8_4_ = fVar27;
                  auVar26._0_8_ = uVar3;
                  auVar26._12_4_ = 0;
                  lVar13 = 0;
                  if (uVar11 != 0) {
                    for (; (uVar11 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                    }
                  }
                  uVar4 = *(undefined8 *)(uVar12 + lVar13 * 8);
                  fVar28 = local_1028[lVar13];
                  auVar25._8_4_ = fVar28;
                  auVar25._0_8_ = uVar4;
                  auVar25._12_4_ = 0;
                  uVar11 = uVar11 - 1 & uVar11;
                  if (uVar11 == 0) {
                    auVar17._8_4_ = -(uint)((int)fVar24 < (int)fVar27);
                    auVar17._4_4_ = auVar17._8_4_;
                    auVar17._0_4_ = auVar17._8_4_;
                    auVar17._12_4_ = auVar17._8_4_;
                    auVar37._8_4_ = fVar27;
                    auVar37._0_8_ = uVar3;
                    auVar37._12_4_ = 0;
                    auVar38 = blendvps(auVar37,auVar23,auVar17);
                    auVar23 = blendvps(auVar23,auVar26,auVar17);
                    auVar18._8_4_ = -(uint)(auVar38._8_4_ < (int)fVar28);
                    auVar18._4_4_ = auVar18._8_4_;
                    auVar18._0_4_ = auVar18._8_4_;
                    auVar18._12_4_ = auVar18._8_4_;
                    auVar32._8_4_ = fVar28;
                    auVar32._0_8_ = uVar4;
                    auVar32._12_4_ = 0;
                    auVar31 = blendvps(auVar32,auVar38,auVar18);
                    auVar25 = blendvps(auVar38,auVar25,auVar18);
                    auVar19._8_4_ = -(uint)(auVar23._8_4_ < auVar25._8_4_);
                    auVar19._4_4_ = auVar19._8_4_;
                    auVar19._0_4_ = auVar19._8_4_;
                    auVar19._12_4_ = auVar19._8_4_;
                    auVar26 = blendvps(auVar25,auVar23,auVar19);
                    auVar23 = blendvps(auVar23,auVar25,auVar19);
                    *local_1010 = auVar23;
                    local_1010[1] = auVar26;
                    local_1010 = local_1010 + 2;
                    uVar9 = auVar31._0_8_;
                  }
                  else {
                    lVar13 = 0;
                    if (uVar11 != 0) {
                      for (; (uVar11 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                      }
                    }
                    auVar31._8_4_ = -(uint)((int)fVar24 < (int)fVar27);
                    auVar31._4_4_ = auVar31._8_4_;
                    auVar31._0_4_ = auVar31._8_4_;
                    auVar31._12_4_ = auVar31._8_4_;
                    auVar39 = blendvps(auVar26,auVar23,auVar31);
                    auVar23 = blendvps(auVar23,auVar26,auVar31);
                    auVar43._8_4_ = local_1028[lVar13];
                    auVar43._0_8_ = *(undefined8 *)(uVar12 + lVar13 * 8);
                    auVar43._12_4_ = 0;
                    auVar38._8_4_ = -(uint)((int)fVar28 < (int)local_1028[lVar13]);
                    auVar38._4_4_ = auVar38._8_4_;
                    auVar38._0_4_ = auVar38._8_4_;
                    auVar38._12_4_ = auVar38._8_4_;
                    auVar31 = blendvps(auVar43,auVar25,auVar38);
                    auVar26 = blendvps(auVar25,auVar43,auVar38);
                    auVar20._8_4_ = -(uint)(auVar23._8_4_ < auVar26._8_4_);
                    auVar20._4_4_ = auVar20._8_4_;
                    auVar20._0_4_ = auVar20._8_4_;
                    auVar20._12_4_ = auVar20._8_4_;
                    auVar38 = blendvps(auVar26,auVar23,auVar20);
                    auVar23 = blendvps(auVar23,auVar26,auVar20);
                    auVar21._8_4_ = -(uint)(auVar39._8_4_ < auVar31._8_4_);
                    auVar21._4_4_ = auVar21._8_4_;
                    auVar21._0_4_ = auVar21._8_4_;
                    auVar21._12_4_ = auVar21._8_4_;
                    auVar26 = blendvps(auVar31,auVar39,auVar21);
                    auVar31 = blendvps(auVar39,auVar31,auVar21);
                    auVar22._8_4_ = -(uint)(auVar31._8_4_ < auVar38._8_4_);
                    auVar22._4_4_ = auVar22._8_4_;
                    auVar22._0_4_ = auVar22._8_4_;
                    auVar22._12_4_ = auVar22._8_4_;
                    auVar25 = blendvps(auVar38,auVar31,auVar22);
                    auVar31 = blendvps(auVar31,auVar38,auVar22);
                    *local_1010 = auVar23;
                    local_1010[1] = auVar31;
                    local_1010[2] = auVar25;
                    local_1010 = local_1010 + 3;
                    uVar9 = auVar26._0_8_;
                    iVar8 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar8 = 6;
          }
        } while (iVar8 == 0);
      } while ((iVar8 != 6) || (local_1008 = (ulong)((uint)uVar9 & 0xf) - 8, local_1008 == 0));
      lVar13 = (uVar9 & 0xfffffffffffffff0) + 0xa0;
      lVar16 = 0;
      uVar9 = 0;
      do {
        local_1000 = uVar9;
        lVar14 = -0x10;
        bVar10 = 0;
        do {
          uVar2 = *(uint *)(lVar13 + lVar14);
          if ((ulong)uVar2 == 0xffffffff) break;
          this = (context->scene->geometries).items[uVar2].ptr;
          context->geomID = uVar2;
          context->primID = *(uint *)(lVar13 + 0x10 + lVar14);
          bVar6 = Geometry::pointQuery(this,query,context);
          bVar10 = bVar10 | bVar6;
          lVar14 = lVar14 + 4;
        } while (lVar14 != 0);
        uVar9 = CONCAT71((int7)(local_1000 >> 8),(byte)local_1000 | bVar10);
        lVar16 = lVar16 + 1;
        lVar13 = lVar13 + 0xb0;
      } while (lVar16 != local_1008);
      auVar44 = local_f98;
    } while ((local_1000 & 1) == 0 && bVar10 == 0);
    auVar44 = *(undefined1 (*) [16])(context->query_radius).field_0.m128;
    fVar24 = auVar44._0_4_;
    fVar27 = auVar44._4_4_;
    fVar28 = auVar44._8_4_;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_f98 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      local_f98 = dpps(auVar44,auVar44,0x7f);
    }
    bVar7 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }